

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void doc_compression_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t bodylen;
  char *__format;
  ulong uVar9;
  long lVar10;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *local_5b8 [5];
  size_t *local_590;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char temp [256];
  char metabuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.purging_interval = 1;
  fconfig.compress_document_body = true;
  fconfig.compaction_threshold = '\0';
  fconfig.flags = fconfig.purging_interval;
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar5 = fdb_set_log_callback(db,logCallbackFunc,"doc_compression_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,2999);
    doc_compression_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,2999,"void doc_compression_test()");
  }
  builtin_strncpy(temp + 0x10,"aaaaaaaaaaaaaaaa",0x10);
  builtin_strncpy(temp,"aaaaaaaaaaaaaaaa",0x10);
  temp._32_4_ = temp._32_4_ & 0xffffff00;
  lVar10 = 0;
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d_%s",uVar9 & 0xffffffff,temp);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_5b8 + lVar10),keybuf,sVar7,metabuf,sVar8,bodybuf,bodylen
                  );
    fdb_set(db,local_5b8[uVar9]);
    lVar10 = lVar10 + 8;
  }
  fdb_doc_create(&rdoc,(void *)local_590[4],*local_590,(void *)local_590[7],local_590[1],(void *)0x0
                 ,0);
  fVar5 = fdb_del(db,rdoc);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xbca);
    doc_compression_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xbca,"void doc_compression_test()");
  }
  fdb_doc_free(rdoc);
  rdoc = (fdb_doc *)0x0;
  fdb_commit(dbfile,'\0');
  fdb_kvs_close(db);
  fdb_close(dbfile);
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar5 = fdb_set_log_callback(db,logCallbackFunc,"doc_compression_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xbda);
    doc_compression_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xbda,"void doc_compression_test()");
  }
  builtin_strncpy(temp + 0x30,"bbbbbbbbbbbbbbbb",0x11);
  builtin_strncpy(temp + 0x20,"bbbbbbbbbbbbbbbb",0x10);
  builtin_strncpy(temp + 0x10,"bbbbbbbbbbbbbbbb",0x10);
  builtin_strncpy(temp,"bbbbbbbbbbbbbbbb",0x10);
  uVar9 = 0;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
    sprintf(metabuf,"newmeta%d",uVar9);
    sprintf(bodybuf,"newbody%d_%s",uVar9,temp);
    sVar7 = strlen(metabuf);
    sVar8 = strlen(bodybuf);
    fdb_doc_update((fdb_doc **)((long)local_5b8 + lVar10),metabuf,sVar7,bodybuf,sVar8);
    fdb_set(db,*(fdb_doc **)((long)local_5b8 + lVar10));
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  lVar10 = 0;
  fdb_commit(dbfile,'\0');
  do {
    if (lVar10 == 10) {
      fdb_compact(dbfile,"./dummy2");
      lVar10 = 0;
      do {
        if (lVar10 == 10) {
          for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
            fdb_doc_free(local_5b8[lVar10]);
          }
          fdb_kvs_close(db);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (doc_compression_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"document compression test");
          return;
        }
        fdb_doc_create(&rdoc,local_5b8[lVar10]->key,local_5b8[lVar10]->keylen,(void *)0x0,0,
                       (void *)0x0,0);
        fVar5 = fdb_get(db,rdoc);
        pfVar4 = rdoc;
        if (lVar10 == 5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc12);
            doc_compression_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc12,"void doc_compression_test()");
          }
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0d);
            doc_compression_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0d,"void doc_compression_test()");
          }
          pvVar1 = rdoc->meta;
          pfVar2 = local_5b8[lVar10];
          pvVar3 = pfVar2->meta;
          iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
          if (iVar6 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0e);
            doc_compression_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0e,"void doc_compression_test()");
          }
          pvVar1 = pfVar4->body;
          pvVar3 = pfVar2->body;
          iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
          if (iVar6 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0f);
            doc_compression_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0f,"void doc_compression_test()");
          }
        }
        fdb_doc_free(pfVar4);
        rdoc = (fdb_doc *)0x0;
        lVar10 = lVar10 + 1;
      } while( true );
    }
    fdb_doc_create(&rdoc,local_5b8[lVar10]->key,local_5b8[lVar10]->keylen,(void *)0x0,0,(void *)0x0,
                   0);
    fVar5 = fdb_get(db,rdoc);
    pfVar4 = rdoc;
    if (lVar10 == 5) {
      if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbfa);
        doc_compression_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbfa,"void doc_compression_test()");
      }
    }
    else {
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf5);
        doc_compression_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbf5,"void doc_compression_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = local_5b8[lVar10];
      pvVar3 = pfVar2->meta;
      iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf6);
        doc_compression_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbf6,"void doc_compression_test()");
      }
      pvVar1 = pfVar4->body;
      pvVar3 = pfVar2->body;
      iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf7);
        doc_compression_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbf7,"void doc_compression_test()");
      }
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void doc_compression_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int dummy_len = 32;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compress_document_body = true;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set dummy str
    memset(temp, 'a', dummy_len);
    temp[dummy_len]=0;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_%s", i, temp);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update dummy str
    dummy_len = 64;
    memset(temp, 'b', dummy_len);
    temp[dummy_len]=0;

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("document compression test");
}